

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

void __thiscall
slang::
TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
::~TypedBumpAllocator
          (TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
           *this)

{
  BumpAllocator *in_RDI;
  unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *cur;
  Segment *seg;
  Segment *local_18;
  Segment *local_10;
  
  for (local_10 = in_RDI->head; local_10 != (Segment *)0x0; local_10 = local_10->prev) {
    for (local_18 = local_10 + 1; local_18 != (Segment *)local_10->current; local_18 = local_18 + 3)
    {
      boost::unordered::
      unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ::~unordered_flat_map
                ((unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  *)0x63579b);
    }
  }
  BumpAllocator::~BumpAllocator(in_RDI);
  return;
}

Assistant:

~TypedBumpAllocator() {
        Segment* seg = head;
        while (seg) {
            for (T* cur = (T*)(seg + 1); cur != (T*)seg->current; cur++)
                cur->~T();
            seg = seg->prev;
        }
    }